

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Designator_PDU::Decode(Designator_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x57 < iVar2 + (uint)KVar1) {
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_DesignatingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
      [3])(&this->m_DesignatingEntityID,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16CodeName);
    (*(this->m_DesignatedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
      [3])(&this->m_DesignatedEntityID,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Code);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Power);
    KDataStream::Read<float>(stream,(float *)&this->m_f32WaveLength);
    (*(this->m_SpotRegardsToEntity).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_SpotRegardsToEntity,stream);
    (*(this->m_SpotLocation).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_SpotLocation,stream)
    ;
    KDataStream::Read(stream,&this->m_ui8DeadReckoningAlgorithm);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    KDataStream::Read(stream,&this->m_ui8Padding2);
    (*(this->m_EntityLinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EntityLinearAcceleration,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Designator_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DESIGNATOR_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_DesignatingEntityID
           >> m_ui16CodeName
           >> KDIS_STREAM m_DesignatedEntityID
           >> m_ui16Code
           >> m_f32Power
           >> m_f32WaveLength
           >> KDIS_STREAM m_SpotRegardsToEntity
           >> KDIS_STREAM m_SpotLocation
           >> m_ui8DeadReckoningAlgorithm
           >> m_ui16Padding1
           >> m_ui8Padding2
           >> KDIS_STREAM m_EntityLinearAcceleration;
}